

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O1

QSize __thiscall QCommandLinkButton::sizeHint(QCommandLinkButton *this)

{
  QCommandLinkButtonPrivate *this_00;
  int iVar1;
  int iVar2;
  QSize QVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  long in_FS_OFFSET;
  QFontMetrics fm;
  undefined1 *local_58;
  QArrayData *local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QCommandLinkButtonPrivate **)(this + 8);
  QVar3 = QPushButton::sizeHint((QPushButton *)this);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QCommandLinkButtonPrivate::titleFont((QCommandLinkButtonPrivate *)&stack0xffffffffffffffb0);
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_58,(QFont *)&stack0xffffffffffffffb0);
  QFont::~QFont((QFont *)&stack0xffffffffffffffb0);
  QAbstractButton::text((QString *)&stack0xffffffffffffffb0,(QAbstractButton *)this);
  iVar1 = QFontMetrics::horizontalAdvance
                    ((QString *)&local_58,(int)(QString *)&stack0xffffffffffffffb0);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  iVar2 = 0x87;
  if (0x87 < iVar1) {
    iVar2 = iVar1;
  }
  iVar1 = QCommandLinkButtonPrivate::textOffset(this_00);
  uVar5 = iVar2 + iVar1 + 4;
  iVar1 = QCommandLinkButtonPrivate::descriptionOffset(this_00);
  uVar4 = (ulong)QVar3 & 0xffffffff;
  if (QVar3.wd.m_i.m_i < (int)uVar5) {
    uVar4 = (ulong)uVar5;
  }
  uVar6 = 0x3c;
  if ((this_00->description).d.size == 0) {
    uVar6 = 0x29;
  }
  iVar2 = QCommandLinkButtonPrivate::descriptionHeight(this_00,uVar5);
  uVar5 = iVar2 + iVar1 + 10;
  if ((int)uVar6 <= (int)uVar5) {
    uVar6 = uVar5;
  }
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSize)(uVar4 | (ulong)uVar6 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QCommandLinkButton::sizeHint() const
{
//  Standard size hints from UI specs
//  Without note: 135, 41
//  With note: 135, 60
    Q_D(const QCommandLinkButton);

    QSize size = QPushButton::sizeHint();
    QFontMetrics fm(d->titleFont());
    int textWidth = qMax(fm.horizontalAdvance(text()), 135);
    int buttonWidth = textWidth + d->textOffset() + d->rightMargin();
    int heightWithoutDescription = d->descriptionOffset() + d->bottomMargin();

    size.setWidth(qMax(size.width(), buttonWidth));
    size.setHeight(qMax(d->description.isEmpty() ? 41 : 60,
                        heightWithoutDescription + d->descriptionHeight(buttonWidth)));
    return size;
}